

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SplayTree.cpp
# Opt level: O1

Node * __thiscall SplayTree::findMax(SplayTree *this,Node *node)

{
  Node *pNVar1;
  
  do {
    if (node == (Node *)0x0) {
      return (Node *)0x0;
    }
    pNVar1 = node;
    node = node->rightChild;
  } while (node != (Node *)0x0);
  return pNVar1;
}

Assistant:

SplayTree::Node *SplayTree::findMax(Node *node) {
    if (node == nullptr) {
        return nullptr;
    } else if (node->rightChild == nullptr) {
        return node;
    } else {
        return findMax(node->rightChild);
    }
}